

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl_flats.cpp
# Opt level: O1

void __thiscall GLFlat::DrawSubsector(GLFlat *this,subsector_t *sub)

{
  float fVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  uint uVar8;
  seg_t *psVar9;
  vertex_t *pvVar10;
  FFlatVertexBuffer *pFVar11;
  FFlatVertex *pFVar12;
  double *pdVar13;
  DWORD DVar14;
  long lVar15;
  float *pfVar16;
  uint uVar17;
  FFlatVertex *pFVar18;
  uint uVar19;
  int iVar20;
  FQuadDrawer qd;
  uint vi [4];
  FQuadDrawer local_58;
  uint local_48 [6];
  
  if (gl.buffermethod == 1) {
    local_58.p = FQuadDrawer::buffer;
    local_48[0] = 0;
    DVar14 = sub->numlines;
    uVar8 = DVar14 - 1;
    if (1 < uVar8) {
      uVar19 = 1;
      iVar20 = 2;
      do {
        if (uVar19 < DVar14 - 3) {
          lVar15 = 0;
          do {
            uVar17 = (int)lVar15 + iVar20;
            if (uVar8 <= uVar17) {
              uVar17 = uVar8;
            }
            local_48[lVar15 + 1] = uVar17;
            lVar15 = lVar15 + 1;
          } while (lVar15 != 3);
          psVar9 = sub->firstline;
          dVar2 = (this->plane).plane.D;
          dVar3 = (this->plane).plane.normal.X;
          dVar4 = (this->plane).plane.normal.Y;
          fVar1 = this->dz;
          dVar5 = (this->plane).plane.negiC;
          pfVar16 = &(local_58.p)->v;
          lVar15 = 0;
          do {
            pvVar10 = psVar9[local_48[lVar15]].v1;
            dVar6 = (pvVar10->p).X;
            dVar7 = (pvVar10->p).Y;
            ((FFlatVertex *)(pfVar16 + -4))->x = (float)dVar6;
            pfVar16[-3] = (float)((dVar7 * dVar4 + dVar3 * dVar6 + dVar2) * dVar5 + (double)fVar1);
            pfVar16[-2] = (float)dVar7;
            pfVar16[-1] = (float)(dVar6 * 0.015625);
            *pfVar16 = (float)(dVar7 * -0.015625);
            lVar15 = lVar15 + 1;
            pfVar16 = pfVar16 + 5;
          } while (lVar15 != 4);
          if (gl.buffermethod == 1) {
            FQuadDrawer::DoRender(&local_58,6);
          }
          else {
            (*_ptrc_glDrawArrays)(6,local_58.ndx,4);
          }
        }
        uVar19 = uVar19 + 2;
        DVar14 = sub->numlines;
        uVar8 = DVar14 - 1;
        iVar20 = iVar20 + 2;
      } while (uVar19 < uVar8);
    }
  }
  else {
    pFVar11 = GLRenderer->mVBO;
    pFVar12 = pFVar11->map;
    uVar8 = pFVar11->mCurIndex;
    pFVar18 = pFVar12 + uVar8;
    uVar19 = sub->numlines;
    if ((ulong)uVar19 != 0) {
      psVar9 = sub->firstline;
      dVar2 = (this->plane).plane.D;
      dVar3 = (this->plane).plane.normal.X;
      dVar4 = (this->plane).plane.normal.Y;
      dVar5 = (this->plane).plane.negiC;
      fVar1 = this->dz;
      lVar15 = 0;
      do {
        pdVar13 = *(double **)((long)&psVar9->v1 + lVar15);
        dVar6 = *pdVar13;
        pFVar18->x = (float)dVar6;
        dVar7 = pdVar13[1];
        pFVar18->z = (float)((dVar7 * dVar4 + dVar3 * dVar6 + dVar2) * dVar5 + (double)fVar1);
        pFVar18->y = (float)dVar7;
        pFVar18->u = (float)(dVar6 * 0.015625);
        pFVar18->v = (float)(dVar7 * -0.015625);
        pFVar18 = pFVar18 + 1;
        lVar15 = lVar15 + 0x48;
      } while ((ulong)uVar19 * 0x48 != lVar15);
    }
    uVar19 = (int)((ulong)((long)pFVar18 - (long)pFVar12) >> 2) * -0x33333333;
    pFVar11->mCurIndex = uVar19;
    if (0x1e828b < uVar19) {
      pFVar11->mCurIndex = pFVar11->mIndex;
    }
    (*_ptrc_glDrawArrays)(6,uVar8,uVar19 - uVar8);
  }
  flatvertices = flatvertices + sub->numlines;
  flatprimitives = flatprimitives + 1;
  return;
}

Assistant:

void GLFlat::DrawSubsector(subsector_t * sub)
{
	if (gl.buffermethod != BM_DEFERRED)
	{
		FFlatVertex *ptr = GLRenderer->mVBO->GetBuffer();
		for (unsigned int k = 0; k < sub->numlines; k++)
		{
			vertex_t *vt = sub->firstline[k].v1;
			ptr->x = vt->fX();
			ptr->z = plane.plane.ZatPoint(vt) + dz;
			ptr->y = vt->fY();
			ptr->u = vt->fX() / 64.f;
			ptr->v = -vt->fY() / 64.f;
			ptr++;
		}
		GLRenderer->mVBO->RenderCurrent(ptr, GL_TRIANGLE_FAN);
	}
	else
	{
		// if we cannot access the buffer, use the quad drawer as fallback by splitting the subsector into quads.
		// Trying to get this into the vertex buffer in the processing pass is too costly and this is only used for render hacks.
		FQuadDrawer qd;
		unsigned int vi[4];

		vi[0] = 0;
		for (unsigned int i = 1; i < sub->numlines-1; i += 2)
		{
			if (i < sub->numlines - 3)
			{
				for (unsigned int j = 1; j < 4; j++)
				{
					vi[j] = MIN(i + j, sub->numlines - 1);
				}
				for (unsigned int x = 0; x < 4; x++)
				{
					vertex_t *vt = sub->firstline[vi[x]].v1;
					qd.Set(x, vt->fX(), plane.plane.ZatPoint(vt) + dz, vt->fY(), vt->fX() / 64.f, -vt->fY() / 64.f);
				}
				qd.Render(GL_TRIANGLE_FAN);
			}
		}
	}

	flatvertices += sub->numlines;
	flatprimitives++;
}